

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O2

lzham_compress_state_ptr lzham::lzham_lib_compress_init(lzham_compress_params *pParams)

{
  lzham_uint32 lVar1;
  lzham_uint32 lVar2;
  lzham_int32 lVar3;
  lzham_uint32 lVar4;
  lzham_uint32 lVar5;
  undefined4 uVar6;
  lzham_uint32 lVar7;
  lzham_uint32 lVar8;
  lzham_compress_level lVar9;
  lzham_uint32 lVar10;
  uint uVar11;
  undefined1 auVar12 [8];
  lzham_compress_status_t lVar13;
  int iVar14;
  lzham_compress_state *p;
  lzham_compress_params *plVar15;
  lzham_compress_state *context;
  undefined1 auVar16 [16];
  lzham_malloc_context malloc_context;
  lzham *local_60;
  undefined1 local_58 [8];
  void *local_50;
  anon_union_8_2_408cf123_for_task_2 aStack_48;
  uint local_40;
  void *local_38;
  void *pvStack_30;
  undefined1 local_28 [16];
  
  if (pParams == (lzham_compress_params *)0x0) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_struct_size != 0x38) {
    return (lzham_compress_state_ptr)0x0;
  }
  if (pParams->m_dict_size_log2 - 0x1e < 0xfffffff1) {
    return (lzham_compress_state_ptr)0x0;
  }
  local_58 = (undefined1  [8])0x0;
  local_50 = (void *)0x200000000;
  aStack_48.m_callback = (task_callback_func)0x8000000000016;
  local_40 = 0;
  local_38 = (void *)0x0;
  pvStack_30 = (void *)0x0;
  local_28._0_4_ = 0;
  local_28._4_8_ = 4;
  plVar15 = pParams;
  lVar13 = create_internal_init_params((init_params *)local_58,pParams);
  if (lVar13 != LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
    return (lzham_compress_state_ptr)0x0;
  }
  auVar16 = lzham::lzham_create_malloc_context((lzham *)0x0,(uint)plVar15);
  local_60 = auVar16._0_8_;
  context = (lzham_compress_state *)&local_60;
  p = lzham_new<lzham::lzham_compress_state,void*>(local_60,context,auVar16._8_8_);
  if (p == (lzham_compress_state *)0x0) goto LAB_00107ec8;
  lVar1 = pParams->m_fast_bytes;
  (p->m_params).m_extreme_parsing_max_best_arrivals = pParams->m_extreme_parsing_max_best_arrivals;
  (p->m_params).m_fast_bytes = lVar1;
  lVar7 = pParams->m_struct_size;
  lVar8 = pParams->m_dict_size_log2;
  lVar9 = pParams->m_level;
  lVar10 = pParams->m_table_update_rate;
  lVar3 = pParams->m_max_helper_threads;
  lVar4 = pParams->m_compress_flags;
  lVar5 = pParams->m_num_seed_bytes;
  uVar6 = *(undefined4 *)&pParams->field_0x1c;
  lVar1 = pParams->m_table_max_update_interval;
  lVar2 = pParams->m_table_update_interval_slow_rate;
  (p->m_params).m_pSeed_bytes = pParams->m_pSeed_bytes;
  (p->m_params).m_table_max_update_interval = lVar1;
  (p->m_params).m_table_update_interval_slow_rate = lVar2;
  (p->m_params).m_max_helper_threads = lVar3;
  (p->m_params).m_compress_flags = lVar4;
  (p->m_params).m_num_seed_bytes = lVar5;
  *(undefined4 *)&(p->m_params).field_0x1c = uVar6;
  (p->m_params).m_struct_size = lVar7;
  (p->m_params).m_dict_size_log2 = lVar8;
  (p->m_params).m_level = lVar9;
  (p->m_params).m_table_update_rate = lVar10;
  p->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
  p->m_pIn_buf = (uint8 *)0x0;
  p->m_pIn_buf_size = (size_t *)0x0;
  p->m_pOut_buf = (uint8 *)0x0;
  p->m_pOut_buf_size = (size_t *)0x0;
  *(undefined8 *)((long)&p->m_pOut_buf_size + 1) = 0;
  *(undefined8 *)((long)&p->m_comp_data_ofs + 1) = 0;
  uVar11 = (uint)local_50;
  auVar12 = local_58;
  if ((uint)local_50 == 0) {
LAB_00107ea3:
    local_58 = auVar12;
    iVar14 = lzcompressor::init(&p->m_compressor,(EVP_PKEY_CTX *)local_58);
    if ((char)iVar14 != '\0') {
      return p;
    }
  }
  else {
    iVar14 = task_pool::init(&p->m_tp,(EVP_PKEY_CTX *)((ulong)local_50 & 0xffffffff));
    if ((char)iVar14 != '\0') {
      auVar12 = (undefined1  [8])p;
      if ((p->m_tp).m_num_threads < uVar11) {
        local_50 = (void *)((ulong)local_50 & 0xffffffff00000000);
        auVar12 = local_58;
      }
      goto LAB_00107ea3;
    }
  }
  lzham_delete<lzham::lzham_compress_state>(local_60,p);
  context = p;
LAB_00107ec8:
  lzham::lzham_destroy_malloc_context(local_60,context);
  return (lzham_compress_state_ptr)0x0;
}

Assistant:

lzham_compress_state_ptr LZHAM_CDECL lzham_lib_compress_init(const lzham_compress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_compress_params)))
      {
         LZHAM_LOG_ERROR(6004);
         return NULL;
      }

      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(6005);
         return NULL;
      }

      lzcompressor::init_params internal_params;
      lzham_compress_status_t status = create_internal_init_params(internal_params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
      {
         LZHAM_LOG_ERROR(6006);
         return NULL;
      }

      lzham_malloc_context malloc_context = lzham_create_malloc_context(0);

      lzham_compress_state *pState = lzham_new<lzham_compress_state>(malloc_context, malloc_context);
      if (!pState)
      {
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6007);
         return NULL;
      }

      pState->m_params = *pParams;

      pState->m_pIn_buf = NULL;
      pState->m_pIn_buf_size = NULL;
      pState->m_pOut_buf = NULL;
      pState->m_pOut_buf_size = NULL;
      pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      pState->m_comp_data_ofs = 0;
      pState->m_finished_compression = false;

      if (internal_params.m_max_helper_threads)
      {
         if (!pState->m_tp.init(internal_params.m_max_helper_threads))
         {
            lzham_delete(malloc_context, pState);
            lzham_destroy_malloc_context(malloc_context);
            LZHAM_LOG_ERROR(6008);
            return NULL;
         }
         if (pState->m_tp.get_num_threads() >= internal_params.m_max_helper_threads)
         {
            internal_params.m_pTask_pool = &pState->m_tp;
         }
         else
         {
            internal_params.m_max_helper_threads = 0;
         }
      }

      if (!pState->m_compressor.init(internal_params))
      {
         lzham_delete(malloc_context, pState);
         lzham_destroy_malloc_context(malloc_context);
         LZHAM_LOG_ERROR(6009);
         return NULL;
      }

      return pState;
   }